

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryMLT.hpp
# Opt level: O2

uint32_t __thiscall
ddd::DictionaryMLT<true,_true>::search_key(DictionaryMLT<true,_true> *this,char *key)

{
  bool bVar1;
  Query query;
  
  query.pos_ = 0;
  query.value_ = 0x7fffffff;
  query.node_pos_ = 0;
  query.is_finished_ = false;
  query.key_ = key;
  bVar1 = DaTrie<true,_true,_true>::search_prefix(*(DaTrie<true,_true,_true> **)(this + 8),&query);
  if (bVar1) {
    if (query.is_finished_ != true) {
      query.node_pos_ = 0;
      bVar1 = DaTrie<true,_true,_false>::search_key
                        (*(DaTrie<true,_true,_false> **)
                          (*(long *)(this + 0x10) + ((ulong)query._8_8_ >> 0x20) * 8),&query);
      if (!bVar1) goto LAB_00130430;
    }
  }
  else {
LAB_00130430:
    query.value_ = 0xffffffff;
  }
  return query.value_;
}

Assistant:

uint32_t search_key(const char* key) const {
    Query query(key);

    if (!prefix_subtrie_->search_prefix(query)) {
      return NOT_FOUND;
    }

    if (query.is_finished()) {
      return query.value();
    }

    query.set_node_pos(ROOT_POS);
    if (!suffix_subtries_[query.value()]->search_key(query)) {
      return NOT_FOUND;
    }
    return query.value();
  }